

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZDICT_optimizeTrainFromBuffer_fastCover
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_fastCover_params_t *parameters)

{
  uint uVar1;
  uint displayLevel;
  uint uVar2;
  long lVar3;
  FASTCOVER_accel_t accelParams;
  double splitPoint;
  ZSTD_customMem customMem;
  int iVar4;
  size_t sVar5;
  POOL_ctx *ctx;
  long *__ptr;
  clock_t cVar6;
  uint f;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  size_t sVar14;
  uint d;
  bool bVar15;
  ulong uVar16;
  COVER_best_t best;
  FASTCOVER_ctx_t local_128;
  pthread_mutex_t local_d8;
  pthread_cond_t local_b0;
  long local_80;
  void *pvStack_78;
  size_t local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong local_38;
  
  uVar16 = -(ulong)(0.0 < parameters->splitPoint);
  uVar9 = parameters->k;
  uVar7 = parameters->d;
  d = 6;
  if (uVar7 != 0) {
    d = uVar7;
  }
  uVar11 = 8;
  if (uVar7 != 0) {
    uVar11 = uVar7;
  }
  uVar7 = 0x28;
  if (parameters->steps != 0) {
    uVar7 = parameters->steps;
  }
  bVar15 = uVar9 != 0;
  uVar12 = 0x32;
  if (bVar15) {
    uVar12 = uVar9;
  }
  uVar8 = 2000;
  if (bVar15) {
    uVar8 = uVar9;
  }
  uVar9 = 0x79e;
  if (bVar15) {
    uVar9 = 0;
  }
  splitPoint = (double)(~uVar16 & 0x3fe8000000000000 | (ulong)parameters->splitPoint & uVar16);
  f = 0x14;
  if (parameters->f != 0) {
    f = parameters->f;
  }
  uVar1 = parameters->accel;
  uVar10 = uVar1 + (uVar1 == 0);
  displayLevel = (parameters->zParams).notificationLevel;
  if (splitPoint <= 1.0) {
    if (uVar1 < 0xb) {
      if (uVar12 < uVar11 || uVar8 < uVar12) {
        sVar14 = 0xffffffffffffffd6;
        if (0 < (int)displayLevel) {
          ZDICT_optimizeTrainFromBuffer_fastCover_cold_11();
        }
      }
      else if (nbSamples == 0) {
        sVar14 = 0xffffffffffffffb8;
        if (0 < (int)displayLevel) {
          ZDICT_optimizeTrainFromBuffer_fastCover_cold_10();
        }
      }
      else if (dictBufferCapacity < 0x100) {
        sVar14 = 0xffffffffffffffba;
        if (0 < (int)displayLevel) {
          ZDICT_optimizeTrainFromBuffer_fastCover_cold_9();
        }
      }
      else {
        if (parameters->nbThreads < 2) {
          ctx = (POOL_ctx *)0x0;
        }
        else {
          customMem.opaque = (void *)0x0;
          customMem.customAlloc = (ZSTD_allocFunction)0x0;
          customMem.customFree = (ZSTD_freeFunction)0x0;
          ctx = POOL_create_advanced((ulong)parameters->nbThreads,1,customMem);
          if (ctx == (POOL_ctx *)0x0) {
            return 0xffffffffffffffc0;
          }
        }
        pthread_mutex_init(&local_d8,(pthread_mutexattr_t *)0x0);
        pthread_cond_init(&local_b0,(pthread_condattr_t *)0x0);
        local_80 = 0;
        pvStack_78 = (void *)0x0;
        local_70 = 0;
        local_38 = 0xffffffffffffffff;
        local_68 = 0;
        uStack_60 = 0;
        local_58 = 0.0;
        uStack_50 = 0;
        local_48 = 0;
        uStack_40 = 0;
        uVar1 = parameters->nbThreads;
        lVar3 = *(long *)&parameters->zParams;
        uVar2 = (parameters->zParams).dictID;
        accelParams = FASTCOVER_defaultAccelParameters[uVar10];
        g_displayLevel = displayLevel - 1;
        bVar15 = g_displayLevel != 0;
        if (displayLevel == 0) {
          g_displayLevel = 0;
        }
        if (bVar15 && 0 < (int)displayLevel) {
          ZDICT_optimizeTrainFromBuffer_fastCover_cold_1();
        }
        if (d <= uVar11) {
          bVar15 = true;
          do {
            if (2 < (int)displayLevel) {
              ZDICT_optimizeTrainFromBuffer_fastCover_cold_2();
            }
            sVar14 = FASTCOVER_ctx_init(&local_128,samplesBuffer,samplesSizes,nbSamples,d,splitPoint
                                        ,f,accelParams);
            if (0xffffffffffffff88 < sVar14) {
              if (0 < (int)displayLevel) {
                ZDICT_optimizeTrainFromBuffer_fastCover_cold_3();
              }
              goto LAB_0018b4a3;
            }
            uVar13 = uVar12;
            if (bVar15) {
              COVER_warnOnSmallCorpus(dictBufferCapacity,local_128.nbDmers,displayLevel);
            }
            do {
              __ptr = (long *)malloc(0x48);
              if (2 < (int)displayLevel) {
                ZDICT_optimizeTrainFromBuffer_fastCover_cold_4();
              }
              if (__ptr == (long *)0x0) {
                if (0 < (int)displayLevel) {
                  ZDICT_optimizeTrainFromBuffer_fastCover_cold_7();
                }
                COVER_best_destroy((COVER_best_t *)&local_d8.__data);
                free(local_128.freqs);
                local_128.freqs = (U32 *)0x0;
                free(local_128.offsets);
                local_128.offsets = (size_t *)0x0;
                sVar14 = 0xffffffffffffffc0;
                goto LAB_0018b4a8;
              }
              *__ptr = (long)&local_128;
              __ptr[1] = (long)&local_d8;
              __ptr[2] = dictBufferCapacity;
              *(uint *)((long)__ptr + 0x24) = uVar1;
              *(undefined4 *)((long)__ptr + 0x34) = 0;
              __ptr[7] = lVar3;
              *(uint *)(__ptr + 8) = uVar2;
              *(undefined4 *)((long)__ptr + 0x44) = 0;
              *(uint *)(__ptr + 3) = uVar13;
              *(uint *)((long)__ptr + 0x1c) = d;
              __ptr[5] = (long)splitPoint;
              *(uint *)(__ptr + 4) = uVar7;
              *(undefined4 *)(__ptr + 6) = 0;
              iVar4 = g_displayLevel;
              *(int *)((long)__ptr + 0x3c) = g_displayLevel;
              if ((((uVar13 == 0) || (d == 0)) || ((d != 8 && (d != 6)))) ||
                 (((local_128.f - 0x20 < 0xffffffe1 || (dictBufferCapacity < uVar13)) ||
                  (uVar13 < d)))) {
                if (0 < iVar4) {
                  ZDICT_optimizeTrainFromBuffer_fastCover_cold_6();
                }
                free(__ptr);
              }
              else {
                pthread_mutex_lock(&local_d8);
                local_80 = local_80 + 1;
                pthread_mutex_unlock(&local_d8);
                if (ctx == (POOL_ctx *)0x0) {
                  FASTCOVER_tryParameters(__ptr);
                }
                else {
                  POOL_add(ctx,FASTCOVER_tryParameters,__ptr);
                }
                if ((1 < (int)displayLevel) &&
                   ((cVar6 = clock(), 150000 < cVar6 - g_time || (3 < displayLevel)))) {
                  ZDICT_optimizeTrainFromBuffer_fastCover_cold_5();
                }
              }
              uVar13 = uVar13 + uVar9 / uVar7 + (uint)(uVar9 / uVar7 == 0);
            } while (uVar13 <= uVar8);
            COVER_best_wait((COVER_best_t *)&local_d8.__data);
            free(local_128.freqs);
            local_128.freqs = (U32 *)0x0;
            free(local_128.offsets);
            d = d + 2;
            bVar15 = false;
          } while (d <= uVar11);
        }
        if (1 < (int)displayLevel) {
          ZDICT_optimizeTrainFromBuffer_fastCover_cold_8();
        }
        sVar5 = local_70;
        sVar14 = local_38;
        if (local_38 < 0xffffffffffffff89) {
          parameters->k = (undefined4)local_68;
          parameters->d = local_68._4_4_;
          parameters->steps = (undefined4)uStack_60;
          parameters->nbThreads = uStack_60._4_4_;
          parameters->splitPoint = local_58;
          parameters->f = f;
          parameters->accel = uVar10;
          (parameters->zParams).compressionLevel = (undefined4)local_48;
          (parameters->zParams).notificationLevel = local_48._4_4_;
          (parameters->zParams).dictID = (uint)uStack_40;
          parameters->shrinkDict = (uint)uStack_50;
          memcpy(dictBuffer,pvStack_78,local_70);
          sVar14 = sVar5;
        }
LAB_0018b4a3:
        COVER_best_destroy((COVER_best_t *)&local_d8.__data);
LAB_0018b4a8:
        POOL_free(ctx);
      }
    }
    else {
      sVar14 = 0xffffffffffffffd6;
      if (0 < (int)displayLevel) {
        ZDICT_optimizeTrainFromBuffer_fastCover_cold_12();
      }
    }
  }
  else {
    sVar14 = 0xffffffffffffffd6;
    if (0 < (int)displayLevel) {
      ZDICT_optimizeTrainFromBuffer_fastCover_cold_13();
    }
  }
  return sVar14;
}

Assistant:

ZDICTLIB_API size_t
ZDICT_optimizeTrainFromBuffer_fastCover(
                    void* dictBuffer, size_t dictBufferCapacity,
                    const void* samplesBuffer,
                    const size_t* samplesSizes, unsigned nbSamples,
                    ZDICT_fastCover_params_t* parameters)
{
    ZDICT_cover_params_t coverParams;
    FASTCOVER_accel_t accelParams;
    /* constants */
    const unsigned nbThreads = parameters->nbThreads;
    const double splitPoint =
        parameters->splitPoint <= 0.0 ? FASTCOVER_DEFAULT_SPLITPOINT : parameters->splitPoint;
    const unsigned kMinD = parameters->d == 0 ? 6 : parameters->d;
    const unsigned kMaxD = parameters->d == 0 ? 8 : parameters->d;
    const unsigned kMinK = parameters->k == 0 ? 50 : parameters->k;
    const unsigned kMaxK = parameters->k == 0 ? 2000 : parameters->k;
    const unsigned kSteps = parameters->steps == 0 ? 40 : parameters->steps;
    const unsigned kStepSize = MAX((kMaxK - kMinK) / kSteps, 1);
    const unsigned kIterations =
        (1 + (kMaxD - kMinD) / 2) * (1 + (kMaxK - kMinK) / kStepSize);
    const unsigned f = parameters->f == 0 ? DEFAULT_F : parameters->f;
    const unsigned accel = parameters->accel == 0 ? DEFAULT_ACCEL : parameters->accel;
    const unsigned shrinkDict = 0;
    /* Local variables */
    const int displayLevel = (int)parameters->zParams.notificationLevel;
    unsigned iteration = 1;
    unsigned d;
    unsigned k;
    COVER_best_t best;
    POOL_ctx *pool = NULL;
    int warned = 0;
    /* Checks */
    if (splitPoint <= 0 || splitPoint > 1) {
      LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect splitPoint\n");
      return ERROR(parameter_outOfBound);
    }
    if (accel == 0 || accel > FASTCOVER_MAX_ACCEL) {
      LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect accel\n");
      return ERROR(parameter_outOfBound);
    }
    if (kMinK < kMaxD || kMaxK < kMinK) {
      LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect k\n");
      return ERROR(parameter_outOfBound);
    }
    if (nbSamples == 0) {
      LOCALDISPLAYLEVEL(displayLevel, 1, "FASTCOVER must have at least one input file\n");
      return ERROR(srcSize_wrong);
    }
    if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) {
      LOCALDISPLAYLEVEL(displayLevel, 1, "dictBufferCapacity must be at least %u\n",
                   ZDICT_DICTSIZE_MIN);
      return ERROR(dstSize_tooSmall);
    }
    if (nbThreads > 1) {
      pool = POOL_create(nbThreads, 1);
      if (!pool) {
        return ERROR(memory_allocation);
      }
    }
    /* Initialization */
    COVER_best_init(&best);
    memset(&coverParams, 0 , sizeof(coverParams));
    FASTCOVER_convertToCoverParams(*parameters, &coverParams);
    accelParams = FASTCOVER_defaultAccelParameters[accel];
    /* Turn down global display level to clean up display at level 2 and below */
    g_displayLevel = displayLevel == 0 ? 0 : displayLevel - 1;
    /* Loop through d first because each new value needs a new context */
    LOCALDISPLAYLEVEL(displayLevel, 2, "Trying %u different sets of parameters\n",
                      kIterations);
    for (d = kMinD; d <= kMaxD; d += 2) {
      /* Initialize the context for this value of d */
      FASTCOVER_ctx_t ctx;
      LOCALDISPLAYLEVEL(displayLevel, 3, "d=%u\n", d);
      {
        size_t const initVal = FASTCOVER_ctx_init(&ctx, samplesBuffer, samplesSizes, nbSamples, d, splitPoint, f, accelParams);
        if (ZSTD_isError(initVal)) {
          LOCALDISPLAYLEVEL(displayLevel, 1, "Failed to initialize context\n");
          COVER_best_destroy(&best);
          POOL_free(pool);
          return initVal;
        }
      }
      if (!warned) {
        COVER_warnOnSmallCorpus(dictBufferCapacity, ctx.nbDmers, displayLevel);
        warned = 1;
      }
      /* Loop through k reusing the same context */
      for (k = kMinK; k <= kMaxK; k += kStepSize) {
        /* Prepare the arguments */
        FASTCOVER_tryParameters_data_t *data = (FASTCOVER_tryParameters_data_t *)malloc(
            sizeof(FASTCOVER_tryParameters_data_t));
        LOCALDISPLAYLEVEL(displayLevel, 3, "k=%u\n", k);
        if (!data) {
          LOCALDISPLAYLEVEL(displayLevel, 1, "Failed to allocate parameters\n");
          COVER_best_destroy(&best);
          FASTCOVER_ctx_destroy(&ctx);
          POOL_free(pool);
          return ERROR(memory_allocation);
        }
        data->ctx = &ctx;
        data->best = &best;
        data->dictBufferCapacity = dictBufferCapacity;
        data->parameters = coverParams;
        data->parameters.k = k;
        data->parameters.d = d;
        data->parameters.splitPoint = splitPoint;
        data->parameters.steps = kSteps;
        data->parameters.shrinkDict = shrinkDict;
        data->parameters.zParams.notificationLevel = (unsigned)g_displayLevel;
        /* Check the parameters */
        if (!FASTCOVER_checkParameters(data->parameters, dictBufferCapacity,
                                       data->ctx->f, accel)) {
          DISPLAYLEVEL(1, "FASTCOVER parameters incorrect\n");
          free(data);
          continue;
        }
        /* Call the function and pass ownership of data to it */
        COVER_best_start(&best);
        if (pool) {
          POOL_add(pool, &FASTCOVER_tryParameters, data);
        } else {
          FASTCOVER_tryParameters(data);
        }
        /* Print status */
        LOCALDISPLAYUPDATE(displayLevel, 2, "\r%u%%       ",
                           (unsigned)((iteration * 100) / kIterations));
        ++iteration;
      }
      COVER_best_wait(&best);
      FASTCOVER_ctx_destroy(&ctx);
    }
    LOCALDISPLAYLEVEL(displayLevel, 2, "\r%79s\r", "");
    /* Fill the output buffer and parameters with output of the best parameters */
    {
      const size_t dictSize = best.dictSize;
      if (ZSTD_isError(best.compressedSize)) {
        const size_t compressedSize = best.compressedSize;
        COVER_best_destroy(&best);
        POOL_free(pool);
        return compressedSize;
      }
      FASTCOVER_convertToFastCoverParams(best.parameters, parameters, f, accel);
      memcpy(dictBuffer, best.dict, dictSize);
      COVER_best_destroy(&best);
      POOL_free(pool);
      return dictSize;
    }

}